

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Client.cpp
# Opt level: O2

void __thiscall
Jupiter::IRC::Client::addNamesToChannel(Client *this,Channel *in_channel,string_view in_names)

{
  size_type __pos;
  pointer pbVar1;
  string_view in_name;
  string_view in_nickname;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  basic_string_view<char,_std::char_traits<char>_> name;
  shared_ptr<Jupiter::IRC::Client::User> user;
  __shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2> local_78;
  undefined1 local_68 [16];
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  names;
  string_view in_names_local;
  
  in_names_local._M_str = in_names._M_str;
  in_names_local._M_len = in_names._M_len;
  jessilib::
  split<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            (&names,&in_names_local,' ');
  for (pbVar1 = names.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pbVar1 != names.
                super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pbVar1 = pbVar1 + 1) {
    name._M_len = pbVar1->_M_len;
    name._M_str = pbVar1->_M_str;
    if (name._M_len != 0) {
      __pos = std::basic_string_view<char,_std::char_traits<char>_>::find_first_not_of
                        (&name,(this->m_prefixes)._M_dataplus._M_p,0,
                         (this->m_prefixes)._M_string_length);
      if (__pos != 0xffffffffffffffff) {
        bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          (&name,__pos,0xffffffffffffffff);
        in_name._M_str = (char *)bVar2._M_len;
        in_name._M_len = (size_t)this;
        findUserOrAdd((Client *)&user,in_name);
        std::__shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_78,
                   (__shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2> *)&user);
        Channel::addUser((Channel *)local_68,(shared_ptr<Jupiter::IRC::Client::User> *)in_channel);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_68 + 8));
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_78._M_refcount);
        while (__pos != 0) {
          in_nickname._M_str =
               ((user.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->m_nickname)._M_dataplus._M_p;
          in_nickname._M_len =
               ((user.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>.
                _M_ptr)->m_nickname)._M_string_length;
          Channel::addUserPrefix(in_channel,in_nickname,name._M_str[__pos - 1]);
          __pos = __pos - 1;
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&user.super___shared_ptr<Jupiter::IRC::Client::User,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount);
      }
    }
  }
  std::
  _Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::~_Vector_base(&names.
                   super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                 );
  return;
}

Assistant:

void Jupiter::IRC::Client::addNamesToChannel(Channel &in_channel, std::string_view in_names) {
	size_t offset;
	std::vector<std::string_view> names = jessilib::split_view(in_names, ' ');
	for (auto name : names) {
		if (name.empty()) {
			// Good candidate for a warning log
			continue;
		}

		offset = name.find_first_not_of(m_prefixes);
		if (offset == std::string_view::npos) {
			// The user's name is nothing but prefixes!? Good candidate for an error log
			continue;
		}

		// Add the user
		auto user = Client::findUserOrAdd(name.substr(offset));
		in_channel.addUser(user);

		// Add any prefixes we received to the user
		while (offset > 0) {
			--offset;
			in_channel.addUserPrefix(user->getNickname(), name[offset]);
		}
	}
}